

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Customer.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
AlchoholicCustomer::order
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,AlchoholicCustomer *this,
          vector<Dish,_std::allocator<Dish>_> *menu)

{
  int *__x;
  int iVar1;
  DishType DVar2;
  int iVar3;
  ulong uVar4;
  const_reference pvVar5;
  size_type sVar6;
  ulong uVar7;
  int local_3c;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar4 = ((long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(menu->super__Vector_base<Dish,_std::allocator<Dish>_>)._M_impl.
                super__Vector_impl_data._M_start) / 0x30;
  if (this->minInx != this->maxInx) {
    __x = &this->minInx;
    if (this->ordered == false) {
      sVar6 = 0;
      uVar7 = uVar4 & 0xffffffff;
      if ((int)uVar4 < 1) {
        uVar7 = sVar6;
      }
      for (; uVar7 != sVar6; sVar6 = sVar6 + 1) {
        pvVar5 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,sVar6);
        DVar2 = Dish::getType(pvVar5);
        if (DVar2 == ALC) {
          pvVar5 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,sVar6);
          iVar3 = Dish::getPrice(pvVar5);
          if (iVar3 < this->minAlc) {
            pvVar5 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,sVar6);
            iVar3 = Dish::getPrice(pvVar5);
            this->minAlc = iVar3;
            this->minInx = (int)sVar6;
          }
        }
        pvVar5 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,sVar6);
        DVar2 = Dish::getType(pvVar5);
        if (DVar2 == ALC) {
          pvVar5 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,sVar6);
          iVar3 = Dish::getPrice(pvVar5);
          if (*(int *)&(this->super_Customer).field_0x2c <= iVar3) {
            pvVar5 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,sVar6);
            iVar3 = Dish::getPrice(pvVar5);
            *(int *)&(this->super_Customer).field_0x2c = iVar3;
            this->maxInx = (int)sVar6;
          }
        }
      }
      if (this->minAlc < 0x7f) {
        std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,__x);
      }
      this->ordered = true;
    }
    else {
      sVar6 = 0;
      uVar7 = uVar4 & 0xffffffff;
      if ((int)uVar4 < 1) {
        uVar7 = sVar6;
      }
      iVar3 = 0x7f;
      local_3c = 0x7f;
      for (; uVar7 != sVar6; sVar6 = sVar6 + 1) {
        pvVar5 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,sVar6);
        iVar1 = Dish::getPrice(pvVar5);
        if (this->minAlc <= iVar1) {
          pvVar5 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,sVar6);
          DVar2 = Dish::getType(pvVar5);
          if (DVar2 == ALC) {
            pvVar5 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,sVar6);
            iVar1 = Dish::getPrice(pvVar5);
            if ((iVar1 == this->minAlc) && ((long)this->minInx < (long)sVar6)) {
              *__x = (int)sVar6;
              pvVar5 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,sVar6);
              iVar3 = Dish::getPrice(pvVar5);
              this->minAlc = iVar3;
              std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,__x);
              return __return_storage_ptr__;
            }
            pvVar5 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,sVar6);
            iVar1 = Dish::getPrice(pvVar5);
            if (this->minAlc < iVar1) {
              pvVar5 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,sVar6);
              iVar1 = Dish::getPrice(pvVar5);
              if (iVar1 < iVar3) {
                pvVar5 = std::vector<Dish,_std::allocator<Dish>_>::at(menu,sVar6);
                iVar3 = Dish::getPrice(pvVar5);
                local_3c = (int)sVar6;
              }
            }
          }
        }
      }
      this->minInx = local_3c;
      this->minAlc = iVar3;
      if (local_3c != 0x7f) {
        std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,__x);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int>  AlchoholicCustomer::order(const std::vector<Dish> &menu)
{
    int lastChecked = INT8_MAX;
    int lastCheckedIndex = INT8_MAX;
    std::vector<int> newOrder;
    int size = menu.size();
    if(minInx == maxInx)
        return newOrder;
    if(!ordered)
    {
        for (int i = 0; i < size; ++i)
        {
            if (menu.at(static_cast<unsigned long>(i)).getType() == ALC && menu.at(
                    static_cast<unsigned long>(i)).getPrice() < minAlc)
            {
                minAlc = menu.at(static_cast<unsigned long>(i)).getPrice();
                minInx = i;
            }

            if(menu.at(static_cast<unsigned long>(i)).getType() == ALC && menu.at(
                    static_cast<unsigned long>(i)).getPrice() >= maxAlc)
            {
                maxAlc = menu.at(static_cast<unsigned long>(i)).getPrice();
                maxInx = i;
            }
        }

        if(minAlc < INT8_MAX)
        {
            newOrder.push_back(minInx);
            ordered = true;
            return newOrder;
        }
        ordered = true;
        return newOrder;
    }
    for (int i = 0; i < size; ++i)
    {
        if(menu.at(static_cast<unsigned long>(i)).getPrice() >= minAlc && menu.at(
                static_cast<unsigned long>(i)).getType() == ALC)
        {
            if(menu.at(static_cast<unsigned long>(i)).getPrice() == minAlc && minInx < i)// && !changed
            {
                minInx = i;
                minAlc = menu.at(static_cast<unsigned long>(i)).getPrice();
                newOrder.push_back(minInx);
                return newOrder;
            }
            else if(menu.at(static_cast<unsigned long>(i)).getPrice() > minAlc && menu.at(
                    static_cast<unsigned long>(i)).getPrice() < lastChecked)
            {
                lastChecked = menu.at(static_cast<unsigned long>(i)).getPrice();
                lastCheckedIndex = i;
            }
        }
    }
    minInx = lastCheckedIndex;
    minAlc = lastChecked;
    if(minInx != INT8_MAX)
        newOrder.push_back(minInx);
    return newOrder;
}